

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcMux.c
# Opt level: O0

Lpk_Res_t * Lpk_MuxAnalize(Lpk_Man_t *pMan,Lpk_Fun_t *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int nVarsMax;
  int iVar4;
  int iVar5;
  int iVar6;
  byte bVar7;
  Lpk_Res_t *local_60;
  int DelayB;
  int DelayA;
  int Delay1;
  int Delay0;
  int Delay;
  int Polarity;
  int Area;
  int Var;
  int nSuppSizeL;
  int nSuppSizeS;
  int nSuppSize1;
  int nSuppSize0;
  Lpk_Fun_t *p_local;
  Lpk_Man_t *pMan_local;
  
  memset(Lpk_MuxAnalize::pRes,0,0x28);
  uVar1 = p->uSupp;
  uVar2 = Kit_BitMask(*(uint *)&p->field_0x8 >> 7 & 0x1f);
  if (uVar1 != uVar2) {
    __assert_fail("p->uSupp == Kit_BitMask(p->nVars)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkAbcMux.c"
                  ,0x33,"Lpk_Res_t *Lpk_MuxAnalize(Lpk_Man_t *, Lpk_Fun_t *)");
  }
  if ((*(uint *)&p->field_0x8 >> 0x1e & 1) == 0) {
    __assert_fail("p->fSupports",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkAbcMux.c"
                  ,0x34,"Lpk_Res_t *Lpk_MuxAnalize(Lpk_Man_t *, Lpk_Fun_t *)");
  }
  Lpk_MuxAnalize::pRes->Variable = -1;
  Polarity = 0;
  do {
    if (0xf < Polarity) {
      if (Lpk_MuxAnalize::pRes->Variable == -1) {
        local_60 = (Lpk_Res_t *)0x0;
      }
      else {
        local_60 = Lpk_MuxAnalize::pRes;
      }
      return local_60;
    }
    bVar7 = (byte)Polarity;
    if ((p->uSupp & 1 << (bVar7 & 0x1f)) != 0) {
      iVar3 = Kit_WordCountOnes(p->puSupps[Polarity << 1]);
      nVarsMax = Kit_WordCountOnes(p->puSupps[Polarity * 2 + 1]);
      if ((int)(*(uint *)&p->field_0x8 >> 7 & 0x1f) <= iVar3) {
        __assert_fail("nSuppSize0 < (int)p->nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkAbcMux.c"
                      ,0x3b,"Lpk_Res_t *Lpk_MuxAnalize(Lpk_Man_t *, Lpk_Fun_t *)");
      }
      if ((int)(*(uint *)&p->field_0x8 >> 7 & 0x1f) <= nVarsMax) {
        __assert_fail("nSuppSize1 < (int)p->nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkAbcMux.c"
                      ,0x3c,"Lpk_Res_t *Lpk_MuxAnalize(Lpk_Man_t *, Lpk_Fun_t *)");
      }
      if ((0 < iVar3) && (0 < nVarsMax)) {
        if (((int)((*(uint *)&p->field_0x8 >> 0xc & 0xf) - 2) < iVar3) ||
           ((int)((*(uint *)&p->field_0x8 >> 0xc & 0xf) - 2) < nVarsMax)) {
          if ((int)((*(uint *)&p->field_0x8 >> 0xc & 0xf) - 2) < iVar3) {
            if ((int)((*(uint *)&p->field_0x8 >> 0xc & 0xf) - 2) < nVarsMax) {
              if ((int)(*(uint *)&p->field_0x8 >> 0xc & 0xf) < iVar3) {
                if ((int)(*(uint *)&p->field_0x8 >> 0xc & 0xf) < nVarsMax) {
                  iVar4 = Lpk_SuppDelay(p->puSupps[Polarity << 1] | 1 << (bVar7 & 0x1f),p->pDelays);
                  iVar5 = Lpk_SuppDelay(p->puSupps[Polarity * 2 + 1],p->pDelays);
                  iVar4 = Abc_MaxInt(iVar4,iVar5 + 1);
                  iVar5 = Lpk_SuppDelay(p->puSupps[Polarity * 2 + 1] | 1 << (bVar7 & 0x1f),
                                        p->pDelays);
                  iVar6 = Lpk_SuppDelay(p->puSupps[Polarity << 1],p->pDelays);
                  iVar5 = Abc_MaxInt(iVar5,iVar6 + 1);
                  Delay1 = Abc_MinInt(iVar4,iVar5);
                  if (Delay1 == iVar4) {
                    iVar4 = Lpk_LutNumLuts(iVar3 + 2,*(uint *)&p->field_0x8 >> 0xc & 0xf);
                    iVar6 = Lpk_LutNumLuts(nVarsMax,*(uint *)&p->field_0x8 >> 0xc & 0xf);
                    Delay = iVar4 + iVar6;
                  }
                  else {
                    iVar4 = Lpk_LutNumLuts(nVarsMax + 2,*(uint *)&p->field_0x8 >> 0xc & 0xf);
                    iVar6 = Lpk_LutNumLuts(iVar3,*(uint *)&p->field_0x8 >> 0xc & 0xf);
                    Delay = iVar4 + iVar6;
                  }
                  Delay0 = (int)(Delay1 == iVar5);
                }
                else {
                  iVar4 = Lpk_SuppDelay(p->puSupps[Polarity << 1] | 1 << (bVar7 & 0x1f),p->pDelays);
                  iVar5 = Lpk_SuppDelay(p->puSupps[Polarity * 2 + 1],p->pDelays);
                  Delay1 = Abc_MaxInt(iVar4,iVar5 + 1);
                  iVar4 = Lpk_LutNumLuts(iVar3 + 2,*(uint *)&p->field_0x8 >> 0xc & 0xf);
                  Delay = iVar4 + 1;
                  Delay0 = 0;
                }
              }
              else {
                iVar4 = Lpk_SuppDelay(p->puSupps[Polarity * 2 + 1] | 1 << (bVar7 & 0x1f),p->pDelays)
                ;
                iVar5 = Lpk_SuppDelay(p->puSupps[Polarity << 1],p->pDelays);
                Delay1 = Abc_MaxInt(iVar4,iVar5 + 1);
                iVar4 = Lpk_LutNumLuts(nVarsMax + 2,*(uint *)&p->field_0x8 >> 0xc & 0xf);
                Delay = iVar4 + 1;
                Delay0 = 1;
              }
            }
            else {
              iVar4 = Lpk_SuppDelay(p->puSupps[Polarity * 2 + 1] | 1 << (bVar7 & 0x1f),p->pDelays);
              iVar5 = Lpk_SuppDelay(p->puSupps[Polarity << 1],p->pDelays);
              Delay1 = Abc_MaxInt(iVar4,iVar5 + 1);
              iVar4 = Lpk_LutNumLuts(iVar3,*(uint *)&p->field_0x8 >> 0xc & 0xf);
              Delay = iVar4 + 1;
              Delay0 = 1;
            }
          }
          else {
            iVar4 = Lpk_SuppDelay(p->puSupps[Polarity << 1] | 1 << (bVar7 & 0x1f),p->pDelays);
            iVar5 = Lpk_SuppDelay(p->puSupps[Polarity * 2 + 1],p->pDelays);
            Delay1 = Abc_MaxInt(iVar4,iVar5 + 1);
            iVar4 = Lpk_LutNumLuts(nVarsMax,*(uint *)&p->field_0x8 >> 0xc & 0xf);
            Delay = iVar4 + 1;
            Delay0 = 0;
          }
        }
        else {
          iVar4 = Lpk_SuppDelay(p->puSupps[Polarity << 1] | 1 << (bVar7 & 0x1f),p->pDelays);
          iVar5 = Lpk_SuppDelay(p->puSupps[Polarity * 2 + 1],p->pDelays);
          iVar4 = Abc_MaxInt(iVar4,iVar5 + 1);
          iVar5 = Lpk_SuppDelay(p->puSupps[Polarity * 2 + 1] | 1 << (bVar7 & 0x1f),p->pDelays);
          iVar6 = Lpk_SuppDelay(p->puSupps[Polarity << 1],p->pDelays);
          iVar5 = Abc_MaxInt(iVar5,iVar6 + 1);
          Delay1 = Abc_MinInt(iVar4,iVar5);
          Delay = 2;
          Delay0 = (int)(Delay1 == iVar5);
        }
        if ((Delay1 <= (int)p->nDelayLim) &&
           (Delay <= (int)(*(uint *)&p->field_0x8 >> 0x10 & 0x3fff))) {
          iVar4 = Abc_MinInt(iVar3 + (uint)((Delay0 != 0 ^ 0xffU) & 1) * 2,nVarsMax + Delay0 * 2);
          iVar3 = Abc_MaxInt(iVar3 + (uint)((Delay0 != 0 ^ 0xffU) & 1) * 2,nVarsMax + Delay0 * 2);
          if ((iVar3 <= (int)(*(uint *)&p->field_0x8 >> 7 & 0x1f)) &&
             ((((Lpk_MuxAnalize::pRes->Variable == -1 || (Delay < Lpk_MuxAnalize::pRes->AreaEst)) ||
               ((Lpk_MuxAnalize::pRes->AreaEst == Delay &&
                (iVar4 + iVar3 < Lpk_MuxAnalize::pRes->nSuppSizeS + Lpk_MuxAnalize::pRes->nSuppSizeL
                )))) || (((Lpk_MuxAnalize::pRes->AreaEst == Delay &&
                          (Lpk_MuxAnalize::pRes->nSuppSizeS + Lpk_MuxAnalize::pRes->nSuppSizeL ==
                           iVar4 + iVar3)) && (Delay1 < Lpk_MuxAnalize::pRes->DelayEst)))))) {
            Lpk_MuxAnalize::pRes->Variable = Polarity;
            Lpk_MuxAnalize::pRes->Polarity = Delay0;
            Lpk_MuxAnalize::pRes->AreaEst = Delay;
            Lpk_MuxAnalize::pRes->DelayEst = Delay1;
            Lpk_MuxAnalize::pRes->nSuppSizeS = iVar4;
            Lpk_MuxAnalize::pRes->nSuppSizeL = iVar3;
          }
        }
      }
    }
    Polarity = Polarity + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Checks the possibility of MUX decomposition.]

  Description [Returns the best variable to use for MUX decomposition.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Lpk_Res_t * Lpk_MuxAnalize( Lpk_Man_t * pMan, Lpk_Fun_t * p )
{
    static Lpk_Res_t Res, * pRes = &Res;
    int nSuppSize0, nSuppSize1, nSuppSizeS, nSuppSizeL;
    int Var, Area, Polarity, Delay, Delay0, Delay1, DelayA, DelayB;
    memset( pRes, 0, sizeof(Lpk_Res_t) );
    assert( p->uSupp == Kit_BitMask(p->nVars) );
    assert( p->fSupports );
    // derive the delay and area after MUX-decomp with each var - and find the best var
    pRes->Variable = -1;
    Lpk_SuppForEachVar( p->uSupp, Var )
    {
        nSuppSize0 = Kit_WordCountOnes(p->puSupps[2*Var+0]);
        nSuppSize1 = Kit_WordCountOnes(p->puSupps[2*Var+1]);
        assert( nSuppSize0 < (int)p->nVars );
        assert( nSuppSize1 < (int)p->nVars );
        if ( nSuppSize0 < 1 || nSuppSize1 < 1 )
            continue;
//printf( "%d %d    ", nSuppSize0, nSuppSize1 );
        if ( nSuppSize0 <= (int)p->nLutK - 2 && nSuppSize1 <= (int)p->nLutK - 2 )
        {
            // include cof var into 0-block
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+0] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+1]           , p->pDelays );
            Delay0 = Abc_MaxInt( DelayA, DelayB + 1 );
            // include cof var into 1-block
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+1] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+0]           , p->pDelays );
            Delay1 = Abc_MaxInt( DelayA, DelayB + 1 );
            // get the best delay
            Delay = Abc_MinInt( Delay0, Delay1 );
            Area = 2;
            Polarity = (int)(Delay == Delay1);
        }
        else if ( nSuppSize0 <= (int)p->nLutK - 2 )
        {
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+0] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+1]           , p->pDelays );
            Delay = Abc_MaxInt( DelayA, DelayB + 1 );
            Area = 1 + Lpk_LutNumLuts( nSuppSize1, p->nLutK );
            Polarity = 0;
        }
        else if ( nSuppSize1 <= (int)p->nLutK - 2 )
        {
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+1] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+0]           , p->pDelays );
            Delay = Abc_MaxInt( DelayA, DelayB + 1 );
            Area = 1 + Lpk_LutNumLuts( nSuppSize0, p->nLutK );
            Polarity = 1;
        }
        else if ( nSuppSize0 <= (int)p->nLutK )
        {
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+1] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+0]           , p->pDelays );
            Delay = Abc_MaxInt( DelayA, DelayB + 1 );
            Area = 1 + Lpk_LutNumLuts( nSuppSize1+2, p->nLutK );
            Polarity = 1;
        }
        else if ( nSuppSize1 <= (int)p->nLutK )
        {
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+0] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+1]           , p->pDelays );
            Delay = Abc_MaxInt( DelayA, DelayB + 1 );
            Area = 1 + Lpk_LutNumLuts( nSuppSize0+2, p->nLutK );
            Polarity = 0;
        }
        else
        {
            // include cof var into 0-block
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+0] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+1]           , p->pDelays );
            Delay0 = Abc_MaxInt( DelayA, DelayB + 1 );
            // include cof var into 1-block
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+1] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+0]           , p->pDelays );
            Delay1 = Abc_MaxInt( DelayA, DelayB + 1 );
            // get the best delay
            Delay = Abc_MinInt( Delay0, Delay1 );
            if ( Delay == Delay0 )
                Area = Lpk_LutNumLuts( nSuppSize0+2, p->nLutK ) + Lpk_LutNumLuts( nSuppSize1, p->nLutK );
            else
                Area = Lpk_LutNumLuts( nSuppSize1+2, p->nLutK ) + Lpk_LutNumLuts( nSuppSize0, p->nLutK );
            Polarity = (int)(Delay == Delay1);
        }
        // find the best variable
        if ( Delay > (int)p->nDelayLim )
            continue;
        if ( Area > (int)p->nAreaLim )
            continue;
        nSuppSizeS = Abc_MinInt( nSuppSize0 + 2 *!Polarity, nSuppSize1 + 2 * Polarity );
        nSuppSizeL = Abc_MaxInt( nSuppSize0 + 2 *!Polarity, nSuppSize1 + 2 * Polarity );
        if ( nSuppSizeL > (int)p->nVars )
            continue;
        if ( pRes->Variable == -1 || pRes->AreaEst > Area || 
            (pRes->AreaEst == Area && pRes->nSuppSizeS + pRes->nSuppSizeL > nSuppSizeS + nSuppSizeL) || 
            (pRes->AreaEst == Area && pRes->nSuppSizeS + pRes->nSuppSizeL == nSuppSizeS + nSuppSizeL && pRes->DelayEst > Delay) )
        {
            pRes->Variable = Var;
            pRes->Polarity = Polarity;
            pRes->AreaEst  = Area;
            pRes->DelayEst = Delay;
            pRes->nSuppSizeS = nSuppSizeS;
            pRes->nSuppSizeL = nSuppSizeL;
        }
    }
    return pRes->Variable == -1 ? NULL : pRes;
}